

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O0

void __thiscall SQLite::Statement::Ptr::Ptr(Ptr *this,Ptr *aPtr)

{
  Ptr *aPtr_local;
  Ptr *this_local;
  
  this->mpSQLite = aPtr->mpSQLite;
  this->mpStmt = aPtr->mpStmt;
  this->mpRefCount = aPtr->mpRefCount;
  if (this->mpRefCount == (uint *)0x0) {
    __assert_fail("NULL != mpRefCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ingjieye[P]telegram-shadowsocks-manager-bot/lib/SQLiteCpp/src/Statement.cpp"
                  ,0x1b1,"SQLite::Statement::Ptr::Ptr(const Statement::Ptr &)");
  }
  if (*this->mpRefCount != 0) {
    *this->mpRefCount = *this->mpRefCount + 1;
    return;
  }
  __assert_fail("0 != *mpRefCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ingjieye[P]telegram-shadowsocks-manager-bot/lib/SQLiteCpp/src/Statement.cpp"
                ,0x1b2,"SQLite::Statement::Ptr::Ptr(const Statement::Ptr &)");
}

Assistant:

Statement::Ptr::Ptr(const Statement::Ptr& aPtr) :
    mpSQLite(aPtr.mpSQLite),
    mpStmt(aPtr.mpStmt),
    mpRefCount(aPtr.mpRefCount)
{
    assert(NULL != mpRefCount);
    assert(0 != *mpRefCount);

    // Increment the reference counter of the sqlite3_stmt,
    // asking not to finalize the sqlite3_stmt during the lifetime of the new objet
    ++(*mpRefCount);
}